

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::interleave
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined2 *puVar3;
  undefined4 *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined2 *puVar9;
  undefined4 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined2 *puVar13;
  undefined4 *puVar14;
  
  if (dt - dt_uint16 < 2) {
    if (nchan != 0) {
      puVar3 = (undefined2 *)((long)dst + (long)nchan * 2);
      iVar5 = vw * (sstride / 2);
      do {
        if (iVar5 != 0) {
          pvVar2 = (void *)((long)src + (long)iVar5 * 2);
          puVar13 = (undefined2 *)dst;
          do {
            if (uw != 0) {
              lVar8 = 0;
              puVar9 = puVar13;
              do {
                *puVar9 = *(undefined2 *)((long)src + lVar8);
                lVar8 = lVar8 + 2;
                puVar9 = puVar9 + nchan;
              } while ((long)uw * 2 != lVar8);
            }
            src = (void *)((long)src + (long)(sstride / 2) * 2);
            puVar13 = puVar13 + dstride / 2;
          } while (src != pvVar2);
        }
        dst = (void *)((long)dst + 2);
      } while ((undefined2 *)dst != puVar3);
    }
  }
  else if (dt == dt_float) {
    if (nchan != 0) {
      iVar5 = dstride + 3;
      if (-1 < dstride) {
        iVar5 = dstride;
      }
      puVar4 = (undefined4 *)((long)dst + (long)nchan * 4);
      iVar7 = sstride + 3;
      if (-1 < sstride) {
        iVar7 = sstride;
      }
      iVar6 = vw * (iVar7 >> 2);
      do {
        if (iVar6 != 0) {
          pvVar2 = (void *)((long)src + (long)iVar6 * 4);
          puVar14 = (undefined4 *)dst;
          do {
            if (uw != 0) {
              lVar8 = 0;
              puVar10 = puVar14;
              do {
                *puVar10 = *(undefined4 *)((long)src + lVar8);
                lVar8 = lVar8 + 4;
                puVar10 = puVar10 + nchan;
              } while ((long)uw * 4 != lVar8);
            }
            src = (void *)((long)src + (long)(iVar7 >> 2) * 4);
            puVar14 = puVar14 + (iVar5 >> 2);
          } while (src != pvVar2);
        }
        dst = (void *)((long)dst + 4);
      } while ((undefined4 *)dst != puVar4);
    }
  }
  else if ((dt == dt_uint8) && (nchan != 0)) {
    puVar1 = (undefined1 *)((long)dst + (long)nchan);
    do {
      if (vw * sstride != 0) {
        pvVar2 = (void *)((long)src + (long)(vw * sstride));
        puVar12 = (undefined1 *)dst;
        do {
          if (uw != 0) {
            lVar8 = 0;
            puVar11 = puVar12;
            do {
              *puVar11 = *(undefined1 *)((long)src + lVar8);
              puVar11 = puVar11 + nchan;
              lVar8 = lVar8 + 1;
            } while (uw != lVar8);
          }
          src = (void *)((long)src + (long)sstride);
          puVar12 = puVar12 + dstride;
        } while (src != pvVar2);
      }
      dst = (void *)((long)dst + 1);
    } while ((undefined1 *)dst != puVar1);
  }
  return;
}

Assistant:

void interleave(const void* src, int sstride, int uw, int vw,
                void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     interleave((const uint8_t*) src, sstride, uw, vw,
                                  (uint8_t*) dst, dstride, nchan); break;
    case dt_half:
    case dt_uint16:    interleave((const uint16_t*) src, sstride, uw, vw,
                                  (uint16_t*) dst, dstride, nchan); break;
    case dt_float:     interleave((const float*) src, sstride, uw, vw,
                                  (float*) dst, dstride, nchan); break;
    }
}